

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_SQUAD::ArchiveOUT(ChFunctionRotation_SQUAD *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionRotation_SQUAD>(marchive);
  ChFunctionRotation::ArchiveOUT(&this->super_ChFunctionRotation,marchive);
  local_38._value = &this->rotations;
  local_38._name = "rotations";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChQuaternion<double>>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *)
       &this->p;
  local_38._name = "p";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *)
       &this->space_fx;
  local_38._name = "space_fx";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_38);
  local_38._value =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *)
       &this->closed;
  local_38._name = "closed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionRotation_SQUAD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionRotation_SQUAD>();
	// serialize parent class
    ChFunctionRotation::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(rotations);
    ////marchive << CHNVP(knots);  //**TODO MATRIX DESERIALIZATION
    marchive << CHNVP(p);
	marchive << CHNVP(space_fx);
	marchive << CHNVP(closed);

}